

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cd_hull.cpp
# Opt level: O1

ConvexH * ConvexDecomposition::ConvexHCrop(ConvexH *convex,Plane *slice)

{
  uchar *puVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  byte bVar6;
  uchar uVar7;
  short sVar8;
  ushort uVar9;
  int iVar10;
  undefined4 uVar11;
  HalfEdge *pHVar12;
  Plane *pPVar13;
  float3 *pfVar14;
  float3 *pfVar15;
  undefined8 uVar16;
  float fVar17;
  undefined1 auVar18 [16];
  int iVar19;
  uint uVar20;
  uint uVar21;
  long lVar22;
  long lVar23;
  ConvexH *this;
  ulong uVar24;
  byte bVar25;
  int iVar26;
  float *pfVar27;
  char *__function;
  uint uVar28;
  long lVar29;
  ulong uVar30;
  short sVar31;
  uint uVar32;
  ulong uVar33;
  byte bVar34;
  uint uVar35;
  ulong uVar36;
  byte bVar37;
  uint uVar38;
  uchar *puVar39;
  int iVar40;
  ulong uVar41;
  uchar *puVar42;
  uchar *puVar43;
  byte bVar44;
  bool bVar45;
  undefined1 auVar46 [16];
  float3 fVar47;
  Array<ConvexDecomposition::float3> createdverts;
  VertFlag vertflag [256];
  HalfEdge tmpunderedges [512];
  Coplanar coplanaredges [512];
  EdgeFlag edgeflag [512];
  Plane tmpunderplanes [128];
  short asStack_31436 [95689];
  uint local_28a4;
  uint local_2898;
  uint local_2894;
  ulong local_2888;
  uint local_2864;
  Array<ConvexDecomposition::float3> local_2858;
  ulong local_2848;
  long local_2840;
  byte abStack_2838 [1024];
  short local_2438;
  byte abStack_2436 [2046];
  ushort uStack_1c38;
  uchar auStack_1c36 [2];
  undefined4 local_1c34;
  uchar local_1c30 [2];
  uchar auStack_1c2e [2040];
  short asStack_1436 [1535];
  Plane local_838 [128];
  
  if (ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)::vertscoplanar ==
      '\0') {
    ConvexHCrop();
  }
  ConvexHCrop::vertscoplanar.count = 0;
  if (ConvexHCrop(ConvexDecomposition::ConvexH&,ConvexDecomposition::Plane_const&)::edgesplit ==
      '\0') {
    ConvexHCrop();
  }
  ConvexHCrop::edgesplit.count = 0;
  if (0x1df < (convex->edges).count) {
    __assert_fail("convex.edges.count<480",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x745,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
  }
  iVar40 = 0;
  memset(local_838,0,0x800);
  local_2858 = (Array<ConvexDecomposition::float3>)(ZEXT816(0) << 0x40);
  lVar22 = (long)(convex->vertices).count;
  local_2888 = 0;
  if (0 < lVar22) {
    fVar2 = (slice->normal).x;
    fVar3 = (slice->normal).y;
    fVar4 = (slice->normal).z;
    fVar5 = slice->dist;
    auVar46._8_4_ = 0x80000000;
    auVar46._0_8_ = 0x8000000080000000;
    auVar46._12_4_ = 0x80000000;
    auVar46 = vxorps_avx512vl(ZEXT416((uint)planetestepsilon),auVar46);
    pfVar27 = &((convex->vertices).element)->z;
    lVar29 = 0;
    local_2888 = 0;
    bVar34 = 0;
    do {
      auVar18 = vfmadd231ss_fma(ZEXT416((uint)(fVar3 * pfVar27[-1])),ZEXT416((uint)fVar2),
                                ZEXT416((uint)((float3 *)(pfVar27 + -2))->x));
      auVar18 = vfmadd231ss_fma(auVar18,ZEXT416((uint)fVar4),ZEXT416((uint)*pfVar27));
      fVar17 = auVar18._0_4_ + fVar5;
      bVar37 = fVar17 < auVar46._0_4_;
      if (planetestepsilon < fVar17) {
        bVar37 = 2;
      }
      abStack_2838[lVar29 * 4] = bVar37;
      if (bVar37 == 2) {
        abStack_2838[lVar29 * 4 + 3] = bVar34;
        bVar34 = bVar34 + 1;
        abStack_2838[lVar29 * 4 + 2] = 0xff;
      }
      else {
        if (bVar37 == 1) {
          abStack_2838[lVar29 * 4 + 2] = (byte)local_2888;
        }
        else {
          abStack_2838[lVar29 * 4 + 2] = (byte)local_2888;
          abStack_2838[lVar29 * 4 + 3] = bVar34;
          bVar34 = bVar34 + 1;
        }
        local_2888 = (ulong)((int)local_2888 + 1);
      }
      lVar29 = lVar29 + 1;
      pfVar27 = pfVar27 + 3;
    } while (lVar22 != lVar29);
  }
  if ((convex->facets).count < 1) {
    uVar32 = 0;
    uVar21 = 0;
  }
  else {
    uVar41 = 0;
    local_2848 = local_2888;
    uVar21 = 0;
    uVar32 = 0;
    iVar40 = 0;
    uVar35 = 0;
    do {
      local_2840 = (ulong)uVar35 << 2;
      local_2898 = 0xffffffff;
      local_28a4 = 0xffffffff;
      local_2894 = 0xffffffff;
      local_2864 = 0;
      uVar24 = (ulong)uVar35;
      bVar34 = 0;
      do {
        iVar19 = (int)uVar24;
        uVar28 = iVar19 + 1;
        iVar26 = (convex->edges).count;
        uVar38 = uVar28;
        uVar20 = uVar35;
        if ((int)uVar28 < iVar26) {
          if ((iVar19 < -1) || ((convex->edges).count <= (int)uVar28)) goto LAB_00930493;
          if (uVar41 == (convex->edges).element[uVar28].p) {
            uVar38 = local_2864;
            uVar20 = uVar28;
          }
        }
        local_2864 = uVar38;
        uVar30 = (ulong)uVar20;
        if ((((iVar19 < 0) || (iVar10 = (convex->edges).count, iVar10 <= iVar19)) ||
            ((int)uVar20 < 0)) || (iVar10 <= (int)uVar20)) goto LAB_00930493;
        pHVar12 = (convex->edges).element;
        uVar38 = (uint)pHVar12[uVar24].ea;
        if ((pHVar12[uVar24].ea < 0) || (iVar10 <= (int)uVar38)) goto LAB_00930493;
        uVar33 = (ulong)pHVar12[uVar24].v;
        bVar37 = abStack_2838[uVar33 * 4];
        bVar44 = bVar34 | bVar37;
        if ((bVar37 == 2) && (abStack_2838[(ulong)pHVar12[uVar30].v * 4] == 2)) {
          asStack_1436[uVar24 * 3] = -1;
        }
        else {
          uVar36 = (ulong)pHVar12[uVar30].v;
          bVar6 = abStack_2838[uVar36 * 4];
          sVar31 = (short)uVar32;
          bVar25 = (byte)iVar40;
          if ((bVar6 | bVar37) == 0) {
            uVar38 = uVar20 + 1;
            if ((int)uVar38 < iVar26) {
              if (((int)uVar20 < -1) || (iVar10 <= (int)uVar38)) goto LAB_00930493;
              if (uVar41 != pHVar12[uVar38].p) goto LAB_0092fc79;
            }
            else {
LAB_0092fc79:
              uVar38 = uVar35;
            }
            if (((int)uVar38 < 0) || (iVar10 <= (int)uVar38)) goto LAB_00930493;
            if (uVar41 != pHVar12[uVar38].p) {
              __assert_fail("convex.edges[e2].p==currentplane",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                            ,0x79a,
                            "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
            }
            if (abStack_2838[(ulong)pHVar12[uVar38].v * 4] == 1) {
              asStack_1436[uVar24 * 3] = sVar31;
              lVar22 = (long)(int)uVar32;
              local_2894 = (uint)abStack_2838[uVar33 * 4 + 2];
              abStack_2436[lVar22 * 4] = abStack_2838[uVar33 * 4 + 2];
              abStack_2436[lVar22 * 4 + 1] = bVar25;
              (&local_2438)[lVar22 * 2] = -1;
              local_28a4 = (uint)abStack_2838[uVar36 * 4 + 2];
              local_2898 = uVar32;
              uVar32 = uVar32 + 1;
            }
            else {
              asStack_1436[uVar24 * 3] = -1;
            }
          }
          else {
            lVar22 = (long)(int)uVar38;
            if ((bVar6 | bVar37) == 1) {
              asStack_1436[uVar24 * 3] = sVar31;
              lVar29 = (long)(int)uVar32;
              abStack_2436[lVar29 * 4] = abStack_2838[uVar33 * 4 + 2];
              abStack_2436[lVar29 * 4 + 1] = bVar25;
              if ((int)uVar38 < iVar19) {
                sVar8 = asStack_1436[lVar22 * 3];
                if ((long)sVar8 == -1) {
                  __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x78d,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                (&local_2438)[lVar29 * 2] = sVar8;
                (&local_2438)[(long)sVar8 * 2] = sVar31;
              }
              uVar32 = uVar32 + 1;
            }
            else {
              uVar28 = (uint)local_2888;
              if ((bVar37 == 1) && (bVar6 == 2)) {
                asStack_1436[uVar24 * 3] = sVar31;
                lVar29 = (long)(int)uVar32;
                abStack_2436[lVar29 * 4] = abStack_2838[uVar33 * 4 + 2];
                abStack_2436[lVar29 * 4 + 1] = bVar25;
                if ((int)uVar38 < iVar19) {
                  lVar23 = (long)asStack_1436[lVar22 * 3];
                  if (lVar23 == -1) {
                    __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                  ,0x7b3,
                                  "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                                 );
                  }
                  (&local_2438)[lVar29 * 2] = asStack_1436[lVar22 * 3];
                  (&local_2438)[lVar23 * 2] = sVar31;
                  uVar28 = (uint)abStack_2436[lVar23 * 4];
                }
                else {
                  iVar26 = (convex->facets).count;
                  if ((iVar26 <= (int)(uint)pHVar12[uVar24].p) ||
                     (iVar26 <= (int)(uint)pHVar12[uVar38].p)) goto LAB_009304f0;
                  pPVar13 = (convex->facets).element;
                  fVar47 = ThreePlaneIntersection
                                     (pPVar13 + pHVar12[uVar24].p,pPVar13 + pHVar12[uVar38].p,slice)
                  ;
                  Array<ConvexDecomposition::float3>::Add(&local_2858,fVar47);
                  local_2888 = (ulong)(uVar28 + 1);
                }
                abStack_2436[lVar29 * 4 + 4] = (byte)uVar28;
                abStack_2436[lVar29 * 4 + 5] = bVar25;
                (abStack_2436 + lVar29 * 4 + 2)[0] = 0xff;
                (abStack_2436 + lVar29 * 4 + 2)[1] = 0xff;
                local_2898 = uVar32 + 1;
                local_2894 = uVar28;
                uVar32 = uVar32 + 2;
              }
              else if ((bVar37 == 0) && (bVar6 == 2)) {
                asStack_1436[uVar24 * 3] = -1;
                if (uVar41 != pHVar12[uVar24].p) {
                  __assert_fail("edge0.p == currentplane",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x7d9,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                bVar45 = (bVar34 & 1) == 0;
                if ((bVar45) && ((int)uVar35 < iVar26)) {
                  puVar39 = &pHVar12->p + local_2840;
                  uVar38 = uVar35;
                  do {
                    if (((int)uVar35 < 0) || (iVar10 <= (int)uVar38)) goto LAB_00930493;
                    if (*puVar39 != pHVar12[uVar24].p) break;
                    bVar44 = bVar44 | abStack_2838[(ulong)puVar39[-1] * 4];
                    bVar45 = (bVar44 & 1) == 0;
                    if (!bVar45) break;
                    uVar38 = uVar38 + 1;
                    puVar39 = puVar39 + 4;
                  } while ((int)uVar38 < iVar26);
                }
                local_2894 = (uint)abStack_2838[uVar33 * 4 + 2];
                if (!bVar45) {
                  lVar22 = (long)(int)uVar32;
                  abStack_2436[lVar22 * 4] = abStack_2838[uVar33 * 4 + 2];
                  abStack_2436[lVar22 * 4 + 1] = bVar25;
                  (&local_2438)[lVar22 * 2] = -1;
                  local_2898 = uVar32;
                  uVar32 = uVar32 + 1;
                }
              }
              else if ((bVar37 == 2) && (bVar6 == 1)) {
                if (local_28a4 != 0xffffffff) {
                  __assert_fail("vin==-1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x7ea,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                if (iVar19 < (int)uVar38) {
                  iVar26 = (convex->facets).count;
                  if ((iVar26 <= (int)(uint)pHVar12[uVar24].p) ||
                     (iVar26 <= (int)(uint)pHVar12[uVar38].p)) goto LAB_009304f0;
                  pPVar13 = (convex->facets).element;
                  fVar47 = ThreePlaneIntersection
                                     (pPVar13 + pHVar12[uVar24].p,pPVar13 + pHVar12[uVar38].p,slice)
                  ;
                  Array<ConvexDecomposition::float3>::Add(&local_2858,fVar47);
                  local_2888 = (ulong)(uVar28 + 1);
                  local_28a4 = uVar28;
                }
                else {
                  lVar22 = (long)asStack_1436[lVar22 * 3];
                  if (abStack_2436[lVar22 * 4 + 1] != abStack_2436[lVar22 * 4 + 5]) {
                    __assert_fail("tmpunderedges[nea].p==tmpunderedges[nea+1].p",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                  ,0x7f6,
                                  "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                                 );
                  }
                  bVar34 = abStack_2436[lVar22 * 4 + 4];
                  local_28a4 = (uint)bVar34;
                  if ((int)uVar28 <= (int)(uint)bVar34) {
                    __assert_fail("vin < vertcountunder",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                  ,0x7f8,
                                  "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                                 );
                  }
                  if ((int)(uint)bVar34 < (int)local_2848) {
                    __assert_fail("vin >= vertcountunderold",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                  ,0x7f9,
                                  "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                                 );
                  }
                }
                lVar22 = (long)(int)uVar32;
                abStack_2436[lVar22 * 4] = (byte)local_28a4;
                abStack_2436[lVar22 * 4 + 1] = bVar25;
                asStack_1436[uVar24 * 3] = sVar31;
                if (pHVar12[uVar24].ea < iVar19) {
                  sVar8 = asStack_1436[(long)(int)pHVar12[uVar24].ea * 3];
                  if ((long)sVar8 == -1) {
                    __assert_fail("edgeflag[edge0.ea].undermap !=-1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                  ,0x805,
                                  "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                                 );
                  }
                  (&local_2438)[lVar22 * 2] = sVar8;
                  (&local_2438)[(long)sVar8 * 2] = sVar31;
                }
                if ((int)sVar31 != uVar32) {
                  __assert_fail("edgeflag[e0].undermap == under_edge_count",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x80a,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                uVar32 = uVar32 + 1;
              }
              else {
                if ((bVar37 != 2) || (bVar6 != 0)) {
                  __assert_fail("0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                                ,0x81b,
                                "ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                               );
                }
                asStack_1436[uVar24 * 3] = -1;
                local_28a4 = (uint)abStack_2838[uVar36 * 4 + 2];
              }
            }
          }
        }
        uVar24 = uVar30;
        bVar34 = bVar44;
      } while (uVar20 != uVar35);
      if ((bVar44 & 1) != 0) {
        if ((long)(convex->facets).count <= (long)uVar41) {
LAB_009304f0:
          __function = 
          "Type &ConvexDecomposition::Array<ConvexDecomposition::Plane>::operator[](int) [Type = ConvexDecomposition::Plane]"
          ;
          goto LAB_009304a8;
        }
        local_838[iVar40] = (convex->facets).element[uVar41];
        iVar40 = iVar40 + 1;
      }
      if ((-1 < (int)local_2894) && ((bVar44 & 1) != 0)) {
        if ((int)local_28a4 < 0) {
          __assert_fail("vin>=0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x82d,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                       );
        }
        if ((int)local_2898 < 0) {
          __assert_fail("coplanaredge>=0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x82e,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                       );
        }
        if (local_2898 == 0x1ff) {
          __assert_fail("coplanaredge!=511",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x82f,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                       );
        }
        lVar22 = (long)(int)uVar21;
        *(short *)(auStack_1c36 + lVar22 * 4 + -2) = (short)local_2898;
        auStack_1c36[lVar22 * 4] = (uchar)local_28a4;
        auStack_1c36[lVar22 * 4 + 1] = (uchar)local_2894;
        uVar21 = uVar21 + 1;
      }
      uVar41 = uVar41 + 1;
      uVar35 = local_2864;
    } while ((long)uVar41 < (long)(convex->facets).count);
  }
  iVar26 = iVar40;
  if (0 < (int)uVar21) {
    iVar26 = iVar40 + 1;
    fVar2 = (slice->normal).y;
    uVar16 = *(undefined8 *)&(slice->normal).z;
    local_838[iVar40].normal.x = (slice->normal).x;
    local_838[iVar40].normal.y = fVar2;
    *(undefined8 *)&local_838[iVar40].normal.z = uVar16;
  }
  if (1 < (int)uVar21) {
    puVar39 = local_1c30;
    lVar22 = 2;
    uVar41 = 0;
    do {
      uVar7 = auStack_1c36[uVar41 * 4 + 1];
      uVar24 = uVar41 + 1;
      if (uVar7 != *(uchar *)((long)&local_1c34 + uVar41 * 4 + 2)) {
        iVar40 = (int)uVar41 + 2;
        if ((int)uVar21 <= iVar40) {
LAB_009304d1:
          __assert_fail("j<coplanaredges_num",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                        ,0x848,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)"
                       );
        }
        if (uVar7 == auStack_1c36[lVar22 * 4]) {
          puVar42 = auStack_1c36 + lVar22 * 4 + -2;
        }
        else {
          iVar40 = (int)lVar22;
          puVar43 = puVar39;
          do {
            if (iVar40 - uVar21 == -1) goto LAB_009304d1;
            iVar40 = iVar40 + 1;
            puVar42 = puVar43 + 4;
            puVar1 = puVar43 + 6;
            puVar43 = puVar42;
          } while (uVar7 != *puVar1);
        }
        uVar11 = *(undefined4 *)(auStack_1c36 + uVar24 * 4 + -2);
        *(undefined4 *)(auStack_1c36 + uVar24 * 4 + -2) = *(undefined4 *)puVar42;
        *(undefined4 *)puVar42 = uVar11;
        if ((int)uVar21 <= iVar40) goto LAB_009304d1;
      }
      lVar22 = lVar22 + 1;
      puVar39 = puVar39 + 4;
      uVar41 = uVar24;
    } while (uVar24 != uVar21 - 1);
  }
  this = (ConvexH *)::operator_new(0x30);
  iVar40 = (int)local_2888;
  ConvexH::ConvexH(this,iVar40,uVar21 + uVar32,iVar26);
  uVar41 = 0;
  uVar35 = 0;
  if (0 < (convex->vertices).count) {
    lVar22 = 0;
    lVar29 = 0;
    uVar35 = 0;
    do {
      if (abStack_2838[lVar29 * 4] != 2) {
        if (((int)uVar35 < 0) || ((this->vertices).count <= (int)uVar35)) goto LAB_00930526;
        pfVar14 = (convex->vertices).element;
        pfVar15 = (this->vertices).element;
        pfVar15[uVar35].z = *(float *)((long)&pfVar14->z + lVar22);
        uVar16 = *(undefined8 *)((long)&pfVar14->x + lVar22);
        pfVar15 = pfVar15 + uVar35;
        pfVar15->x = (float)(int)uVar16;
        pfVar15->y = (float)(int)((ulong)uVar16 >> 0x20);
        uVar35 = uVar35 + 1;
      }
      lVar29 = lVar29 + 1;
      lVar22 = lVar22 + 0xc;
    } while (lVar29 < (convex->vertices).count);
  }
  if (iVar40 - uVar35 != 0 && (int)uVar35 <= iVar40) {
    uVar24 = 0;
    uVar30 = (ulong)uVar35;
    do {
      if ((((long)local_2858.count <= (long)uVar24) || ((int)uVar35 < 0)) ||
         ((this->vertices).count <= (int)uVar30)) goto LAB_00930526;
      uVar41 = uVar24 + 1;
      pfVar15 = (this->vertices).element;
      pfVar15[uVar30].z = local_2858.element[uVar24].z;
      fVar2 = local_2858.element[uVar24].y;
      pfVar15 = pfVar15 + uVar30;
      pfVar15->x = local_2858.element[uVar24].x;
      pfVar15->y = fVar2;
      uVar24 = uVar41;
      uVar30 = uVar30 + 1;
    } while (uVar41 != iVar40 - uVar35);
  }
  if ((int)uVar41 != local_2858.count) {
    __assert_fail("i==createdverts.count",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                  ,0x859,"ConvexH *ConvexDecomposition::ConvexHCrop(ConvexH &, const Plane &)");
  }
  if (0 < (int)uVar21) {
    uVar41 = 0;
    uVar35 = uVar32;
    do {
      if (((int)uVar32 < 0) || ((this->edges).count <= (int)uVar35)) goto LAB_00930493;
      pHVar12 = (this->edges).element;
      pHVar12[uVar32 + uVar41].p = (char)iVar26 + 0xff;
      if ((this->edges).count <= (int)uVar35) goto LAB_00930493;
      uVar9 = *(ushort *)(auStack_1c36 + uVar41 * 4 + -2);
      pHVar12[uVar32 + uVar41].ea = uVar9;
      (&local_2438)[(ulong)uVar9 * 2] = (short)uVar35;
      if ((this->edges).count <= (int)uVar35) goto LAB_00930493;
      pHVar12[uVar32 + uVar41].v = auStack_1c36[uVar41 * 4];
      uVar41 = uVar41 + 1;
      uVar35 = uVar35 + 1;
    } while (uVar21 != uVar41);
  }
  memcpy((this->edges).element,&local_2438,(long)(int)uVar32 << 2);
  memcpy((this->facets).element,local_838,(long)iVar26 << 4);
  if (local_2858.element != (float3 *)0x0) {
    free(local_2858.element);
  }
  return this;
LAB_00930526:
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::float3>::operator[](int) [Type = ConvexDecomposition::float3]"
  ;
  goto LAB_009304a8;
LAB_00930493:
  __function = 
  "Type &ConvexDecomposition::Array<ConvexDecomposition::ConvexH::HalfEdge>::operator[](int) [Type = ConvexDecomposition::ConvexH::HalfEdge]"
  ;
LAB_009304a8:
  __assert_fail("i>=0 && i<count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono/collision/gimpact/ConvexDecomposition/cd_hull.cpp"
                ,0x577,__function);
}

Assistant:

ConvexH *ConvexHCrop(ConvexH &convex,const Plane &slice)
{
	int i;
	int vertcountunder=0;
	int vertcountover =0;
	static Array<int> vertscoplanar;  // existing vertex members of convex that are coplanar
	vertscoplanar.count=0;
	static Array<int> edgesplit;  // existing edges that members of convex that cross the splitplane
	edgesplit.count=0;

	assert(convex.edges.count<480);

	EdgeFlag  edgeflag[512];
	VertFlag  vertflag[256];
	PlaneFlag planeflag[128];
	HalfEdge  tmpunderedges[512];
	Plane	  tmpunderplanes[128];
	Coplanar coplanaredges[512];
	int coplanaredges_num=0;

	Array<REAL3> createdverts;
	// do the side-of-plane tests
	for(i=0;i<convex.vertices.count;i++) {
		vertflag[i].planetest = PlaneTest(slice,convex.vertices[i]);
		if(vertflag[i].planetest == COPLANAR) {
			// ? vertscoplanar.Add(i);
			vertflag[i].undermap = vertcountunder++;
			vertflag[i].overmap  = vertcountover++;
		}
		else if(vertflag[i].planetest == UNDER)	{
			vertflag[i].undermap = vertcountunder++;
		}
		else {
			assert(vertflag[i].planetest == OVER);
			vertflag[i].overmap  = vertcountover++;
			vertflag[i].undermap = 255; // for debugging purposes
		}
	}
	int vertcountunderold = vertcountunder; // for debugging only

	int under_edge_count =0;
	int underplanescount=0;
	int e0=0;

	for(int currentplane=0; currentplane<convex.facets.count; currentplane++) {
		int estart =e0;
		int enextface = 0;
		int planeside = 0;
		int e1 = e0+1;
		int vout=-1;
		int vin =-1;
		int coplanaredge = -1;
		do{

			if(e1 >= convex.edges.count || convex.edges[e1].p!=currentplane) {
				enextface = e1;
				e1=estart;
			}
			HalfEdge &edge0 = convex.edges[e0];
			HalfEdge &edge1 = convex.edges[e1];
			HalfEdge &edgea = convex.edges[edge0.ea];


			planeside |= vertflag[edge0.v].planetest;
			//if((vertflag[edge0.v].planetest & vertflag[edge1.v].planetest)  == COPLANAR) {
			//	assert(ecop==-1);
			//	ecop=e;
			//}


			if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == OVER){
				// both endpoints over plane
				edgeflag[e0].undermap  = -1;
			}
			else if((vertflag[edge0.v].planetest | vertflag[edge1.v].planetest)  == UNDER) {
				// at least one endpoint under, the other coplanar or under
				
				edgeflag[e0].undermap = under_edge_count;
				tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
				tmpunderedges[under_edge_count].p = underplanescount;
				if(edge0.ea < e0) {
					// connect the neighbors
					assert(edgeflag[edge0.ea].undermap !=-1);
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
				}
				under_edge_count++;
			}
			else if((vertflag[edge0.v].planetest | vertflag[edge1.v].planetest)  == COPLANAR) {
				// both endpoints coplanar 
				// must check a 3rd point to see if UNDER
				int e2 = e1+1;
				if(e2>=convex.edges.count || convex.edges[e2].p!=currentplane) {
					e2 = estart;
				}
				assert(convex.edges[e2].p==currentplane);
				HalfEdge &edge2 = convex.edges[e2];
				if(vertflag[edge2.v].planetest==UNDER) {
					
					edgeflag[e0].undermap = under_edge_count;
					tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
					tmpunderedges[under_edge_count].p = underplanescount;
					tmpunderedges[under_edge_count].ea = -1;
					// make sure this edge is added to the "coplanar" list
					coplanaredge = under_edge_count;
					vout = vertflag[edge0.v].undermap;
					vin  = vertflag[edge1.v].undermap;
					under_edge_count++;
				}
				else {
					edgeflag[e0].undermap = -1;
				}
			}
			else if(vertflag[edge0.v].planetest == UNDER && vertflag[edge1.v].planetest == OVER) {
				// first is under 2nd is over 
				
				edgeflag[e0].undermap = under_edge_count;
				tmpunderedges[under_edge_count].v = vertflag[edge0.v].undermap;
				tmpunderedges[under_edge_count].p = underplanescount;
				if(edge0.ea < e0) {
					assert(edgeflag[edge0.ea].undermap !=-1);
					// connect the neighbors
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
					vout = tmpunderedges[edgeflag[edge0.ea].undermap].v;
				}
				else {
					Plane &p0 = convex.facets[edge0.p];
					Plane &pa = convex.facets[edgea.p];
					createdverts.Add(ThreePlaneIntersection(p0,pa,slice));
					//createdverts.Add(PlaneProject(slice,PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v])));
					//createdverts.Add(PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v]));
					vout = vertcountunder++;
				}
				under_edge_count++;
				/// hmmm something to think about: i might be able to output this edge regarless of 
				// wheter or not we know v-in yet.  ok i;ll try this now:
				tmpunderedges[under_edge_count].v = vout;
				tmpunderedges[under_edge_count].p = underplanescount;
				tmpunderedges[under_edge_count].ea = -1;
				coplanaredge = under_edge_count;
				under_edge_count++;

				if(vin!=-1) {
					// we previously processed an edge  where we came under
					// now we know about vout as well

					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}

			}
			else if(vertflag[edge0.v].planetest == COPLANAR && vertflag[edge1.v].planetest == OVER) {
				// first is coplanar 2nd is over 
				
				edgeflag[e0].undermap = -1;
				vout = vertflag[edge0.v].undermap;
				// I hate this but i have to make sure part of this face is UNDER before ouputting this vert
				int k=estart;
				assert(edge0.p == currentplane);
				while(!(planeside&UNDER) && k<convex.edges.count && convex.edges[k].p==edge0.p) {
					planeside |= vertflag[convex.edges[k].v].planetest;
					k++;
				}
				if(planeside&UNDER){
					tmpunderedges[under_edge_count].v = vout;
					tmpunderedges[under_edge_count].p = underplanescount;
					tmpunderedges[under_edge_count].ea = -1;
					coplanaredge = under_edge_count; // hmmm should make a note of the edge # for later on
					under_edge_count++;
					
				}
			}
			else if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == UNDER) {
				// first is over next is under 
				// new vertex!!!
				assert(vin==-1);
				if(e0<edge0.ea) {
					Plane &p0 = convex.facets[edge0.p];
					Plane &pa = convex.facets[edgea.p];
					createdverts.Add(ThreePlaneIntersection(p0,pa,slice));
					//createdverts.Add(PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v]));
					//createdverts.Add(PlaneProject(slice,PlaneLineIntersection(slice,convex.vertices[edge0.v],convex.vertices[edgea.v])));
					vin = vertcountunder++;
				}
				else {
					// find the new vertex that was created by edge[edge0.ea]
					int nea = edgeflag[edge0.ea].undermap;
					assert(tmpunderedges[nea].p==tmpunderedges[nea+1].p);
					vin = tmpunderedges[nea+1].v;
					assert(vin < vertcountunder);
					assert(vin >= vertcountunderold);   // for debugging only
				}
				if(vout!=-1) {
					// we previously processed an edge  where we went over
					// now we know vin too
					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}
				// output edge
				tmpunderedges[under_edge_count].v = vin;
				tmpunderedges[under_edge_count].p = underplanescount;
				edgeflag[e0].undermap = under_edge_count;
				if(e0>edge0.ea) {
					assert(edgeflag[edge0.ea].undermap !=-1);
					// connect the neighbors
					tmpunderedges[under_edge_count].ea = edgeflag[edge0.ea].undermap;
					tmpunderedges[edgeflag[edge0.ea].undermap].ea = under_edge_count;
				}
				assert(edgeflag[e0].undermap == under_edge_count);
				under_edge_count++;
			}
			else if(vertflag[edge0.v].planetest == OVER && vertflag[edge1.v].planetest == COPLANAR) {
				// first is over next is coplanar 
				
				edgeflag[e0].undermap = -1;
				vin = vertflag[edge1.v].undermap;
				assert(vin!=-1);
				if(vout!=-1) {
					// we previously processed an edge  where we came under
					// now we know both endpoints
					// ADD THIS EDGE TO THE LIST OF EDGES THAT NEED NEIGHBOR ON PARTITION PLANE!!
				}

			}
			else {
				assert(0);
			}
			

			e0=e1;
			e1++; // do the modulo at the beginning of the loop

		} while(e0!=estart) ;
		e0 = enextface;
		if(planeside&UNDER) {
			planeflag[currentplane].undermap = underplanescount;
			tmpunderplanes[underplanescount] = convex.facets[currentplane];
			underplanescount++;
		}
		else {
			planeflag[currentplane].undermap = 0;
		}
		if(vout>=0 && (planeside&UNDER)) {
			assert(vin>=0);
			assert(coplanaredge>=0);
			assert(coplanaredge!=511);
			coplanaredges[coplanaredges_num].ea = coplanaredge;
			coplanaredges[coplanaredges_num].v0 = vin;
			coplanaredges[coplanaredges_num].v1 = vout;
			coplanaredges_num++;
		}
	}

	// add the new plane to the mix:
	if(coplanaredges_num>0) {
		tmpunderplanes[underplanescount++]=slice;
	}
	for(i=0;i<coplanaredges_num-1;i++) {
		if(coplanaredges[i].v1 != coplanaredges[i+1].v0) {
			int j = 0;
			for(j=i+2;j<coplanaredges_num;j++) {
				if(coplanaredges[i].v1 == coplanaredges[j].v0) {
					Coplanar tmp = coplanaredges[i+1];
					coplanaredges[i+1] = coplanaredges[j];
					coplanaredges[j] = tmp;
					break;
				}
			}
			if(j>=coplanaredges_num)
			{
				assert(j<coplanaredges_num);
				return NULL;
			}
		}
	}
	ConvexH *punder = new ConvexH(vertcountunder,under_edge_count+coplanaredges_num,underplanescount);
	ConvexH &under = *punder;
	int k=0;
	for(i=0;i<convex.vertices.count;i++) {
		if(vertflag[i].planetest != OVER){
			under.vertices[k++] = convex.vertices[i];
		}
	}
	i=0;
	while(k<vertcountunder) {
		under.vertices[k++] = createdverts[i++];
	}
	assert(i==createdverts.count);

	for(i=0;i<coplanaredges_num;i++) {
		under.edges[under_edge_count+i].p  = underplanescount-1;
		under.edges[under_edge_count+i].ea = coplanaredges[i].ea;
		tmpunderedges[coplanaredges[i].ea].ea = under_edge_count+i;
		under.edges[under_edge_count+i].v  = coplanaredges[i].v0;
	}
	
	memcpy(under.edges.element,tmpunderedges,sizeof(HalfEdge)*under_edge_count);
	memcpy(under.facets.element,tmpunderplanes,sizeof(Plane)*underplanescount);
	return punder;
}